

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O1

int32_t icu_63::RegexCImpl::appendTail
                  (RegularExpression *regexp,UChar **destBuf,int32_t *destCapacity,
                  UErrorCode *status)

{
  UChar *pUVar1;
  RegexMatcher *pRVar2;
  long limit;
  bool bVar3;
  bool bVar4;
  UErrorCode UVar5;
  int iVar6;
  int iVar7;
  int32_t iVar8;
  int64_t start;
  int32_t iVar9;
  UErrorCode newStatus;
  UErrorCode local_34;
  
  bVar3 = true;
  if (((destCapacity != (int32_t *)0x0) && (*status == U_BUFFER_OVERFLOW_ERROR)) &&
     (*destCapacity == 0)) {
    *status = U_ZERO_ERROR;
    bVar3 = false;
  }
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  iVar9 = 0;
  UVar5 = U_ILLEGAL_ARGUMENT_ERROR;
  iVar8 = 0;
  if ((regexp == (RegularExpression *)0x0) || (iVar8 = iVar9, regexp->fMagic != 0x72657870))
  goto LAB_0015d24d;
  if ((regexp->fText == (UChar *)0x0) && (regexp->fOwnsText == '\0')) {
    UVar5 = U_REGEX_INVALID_STATE;
    goto LAB_0015d24d;
  }
  if ((destBuf == (UChar **)0x0 || destCapacity == (int32_t *)0x0) ||
     ((pUVar1 = *destBuf, pUVar1 == (UChar *)0x0 && (0 < *destCapacity)))) goto LAB_0015d24d;
  iVar7 = *destCapacity;
  if ((long)iVar7 < 0) goto LAB_0015d24d;
  pRVar2 = regexp->fMatcher;
  if (regexp->fText == (UChar *)0x0) {
    if (pRVar2->fMatch == '\0') {
      start = 0;
      if (pRVar2->fLastMatchEnd != -1) {
        start = pRVar2->fLastMatchEnd;
      }
    }
    else {
      start = pRVar2->fMatchEnd;
    }
    iVar8 = utext_extract_63(pRVar2->fInputText,start,pRVar2->fInputLength,pUVar1,iVar7,status);
  }
  else {
    limit = pRVar2->fSmallData[(ulong)(pRVar2->fMatch == '\0') - 7];
    iVar8 = 0;
    iVar6 = 0;
    if (limit != -1) {
      if (pRVar2->fInputText->pFuncs->mapNativeIndexToUTF16 == (UTextMapNativeIndexToUTF16 *)0x0) {
        iVar6 = (int)limit;
      }
      else {
        local_34 = U_ZERO_ERROR;
        iVar6 = utext_extract_63(pRVar2->fInputText,0,limit,(UChar *)0x0,0,&local_34);
      }
    }
    iVar9 = regexp->fTextLength;
    do {
      if (iVar6 == iVar9) break;
      if (iVar9 == -1 && regexp->fText[iVar6] == L'\0') {
        regexp->fTextLength = iVar6;
        bVar4 = false;
        iVar9 = iVar6;
      }
      else {
        if (iVar8 < iVar7) {
          pUVar1[iVar8] = regexp->fText[iVar6];
        }
        else if (0 < iVar9) {
          iVar8 = (iVar8 - iVar6) + iVar9;
          bVar4 = false;
          goto LAB_0015d1bf;
        }
        iVar6 = iVar6 + 1;
        iVar8 = iVar8 + 1;
        bVar4 = true;
      }
LAB_0015d1bf:
    } while (bVar4);
  }
  if (iVar8 < iVar7) {
    pUVar1[iVar8] = L'\0';
  }
  else if (iVar8 == iVar7) {
    *status = U_STRING_NOT_TERMINATED_WARNING;
  }
  else {
    *status = U_BUFFER_OVERFLOW_ERROR;
  }
  pUVar1 = *destBuf;
  if (iVar8 < iVar7) {
    *destBuf = pUVar1 + iVar8;
    iVar7 = *destCapacity - iVar8;
LAB_0015d23b:
    *destCapacity = iVar7;
  }
  else if (pUVar1 != (UChar *)0x0) {
    *destBuf = pUVar1 + iVar7;
    iVar7 = 0;
    goto LAB_0015d23b;
  }
  if (bVar3) {
    return iVar8;
  }
  if (U_ZERO_ERROR < *status) {
    return iVar8;
  }
  UVar5 = U_BUFFER_OVERFLOW_ERROR;
LAB_0015d24d:
  *status = UVar5;
  return iVar8;
}

Assistant:

int32_t RegexCImpl::appendTail(RegularExpression    *regexp,
                               UChar                **destBuf,
                               int32_t               *destCapacity,
                               UErrorCode            *status)
{

    // If we come in with a buffer overflow error, don't suppress the operation.
    //  A series of appendReplacements, appendTail need to correctly preflight
    //  the buffer size when an overflow happens somewhere in the middle.
    UBool pendingBufferOverflow = FALSE;
    if (*status == U_BUFFER_OVERFLOW_ERROR && destCapacity != NULL && *destCapacity == 0) {
        pendingBufferOverflow = TRUE;
        *status = U_ZERO_ERROR;
    }

    if (validateRE(regexp, TRUE, status) == FALSE) {
        return 0;
    }

    if (destCapacity == NULL || destBuf == NULL ||
        (*destBuf == NULL && *destCapacity > 0) ||
        *destCapacity < 0)
    {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    RegexMatcher *m = regexp->fMatcher;

    int32_t  destIdx     = 0;
    int32_t  destCap     = *destCapacity;
    UChar    *dest       = *destBuf;

    if (regexp->fText != NULL) {
        int32_t srcIdx;
        int64_t nativeIdx = (m->fMatch ? m->fMatchEnd : m->fLastMatchEnd);
        if (nativeIdx == -1) {
            srcIdx = 0;
        } else if (UTEXT_USES_U16(m->fInputText)) {
            srcIdx = (int32_t)nativeIdx;
        } else {
            UErrorCode newStatus = U_ZERO_ERROR;
            srcIdx = utext_extract(m->fInputText, 0, nativeIdx, NULL, 0, &newStatus);
        }

        for (;;) {
            U_ASSERT(destIdx >= 0);

            if (srcIdx == regexp->fTextLength) {
                break;
            }
            UChar c = regexp->fText[srcIdx];
            if (c == 0 && regexp->fTextLength == -1) {
                regexp->fTextLength = srcIdx;
                break;
            }

            if (destIdx < destCap) {
                dest[destIdx] = c;
            } else {
                // We've overflowed the dest buffer.
                //  If the total input string length is known, we can
                //    compute the total buffer size needed without scanning through the string.
                if (regexp->fTextLength > 0) {
                    destIdx += (regexp->fTextLength - srcIdx);
                    break;
                }
            }
            srcIdx++;
            destIdx++;
        }
    } else {
        int64_t  srcIdx;
        if (m->fMatch) {
            // The most recent call to find() succeeded.
            srcIdx = m->fMatchEnd;
        } else {
            // The last call to find() on this matcher failed().
            //   Look back to the end of the last find() that succeeded for src index.
            srcIdx = m->fLastMatchEnd;
            if (srcIdx == -1)  {
                // There has been no successful match with this matcher.
                //   We want to copy the whole string.
                srcIdx = 0;
            }
        }

        destIdx = utext_extract(m->fInputText, srcIdx, m->fInputLength, dest, destCap, status);
    }

    //
    //  NUL terminate the output string, if possible, otherwise issue the
    //   appropriate error or warning.
    //
    if (destIdx < destCap) {
        dest[destIdx] = 0;
    } else  if (destIdx == destCap) {
        *status = U_STRING_NOT_TERMINATED_WARNING;
    } else {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }

    //
    // Update the user's buffer ptr and capacity vars to reflect the
    //   amount used.
    //
    if (destIdx < destCap) {
        *destBuf      += destIdx;
        *destCapacity -= destIdx;
    } else if (*destBuf != NULL) {
        *destBuf      += destCap;
        *destCapacity  = 0;
    }

    if (pendingBufferOverflow && U_SUCCESS(*status)) {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }

    return destIdx;
}